

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall
ON_Extrusion::GetSurfaceParameterFromNurbFormParameter
          (ON_Extrusion *this,double nurbs_s,double nurbs_t,double *surface_s,double *surface_t)

{
  undefined1 uVar1;
  double *pdVar3;
  undefined4 uVar4;
  int iVar2;
  
  uVar4 = SUB84(nurbs_s,0);
  pdVar3 = surface_t;
  if (this->m_bTransposed == true) {
    pdVar3 = surface_s;
    surface_s = surface_t;
    uVar4 = SUB84(nurbs_t,0);
    nurbs_t = nurbs_s;
  }
  if (surface_s == (double *)0x0) {
    uVar1 = 1;
  }
  else if (this->m_profile == (ON_Curve *)0x0) {
    uVar1 = 0;
  }
  else {
    iVar2 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])(uVar4);
    uVar1 = (undefined1)iVar2;
  }
  if (pdVar3 != (double *)0x0) {
    *pdVar3 = nurbs_t;
  }
  return (bool)uVar1;
}

Assistant:

bool ON_Extrusion::GetSurfaceParameterFromNurbFormParameter(
      double nurbs_s, double nurbs_t,
      double* surface_s, double* surface_t
      ) const
{
  bool rc = true;
  if ( m_bTransposed )
  {
    double* p = surface_s; 
    surface_s = surface_t; 
    surface_t = p;
    double t = nurbs_s;
    nurbs_s = nurbs_t;
    nurbs_t = t;
  }
  if ( surface_s )
  {
    rc = m_profile 
       ? (m_profile->GetCurveParameterFromNurbFormParameter(nurbs_s,surface_s)?true:false) 
       : false;
  }
  if ( surface_t )
    *surface_t = nurbs_t;
  return rc;
}